

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

FeatureOptions<wasm::UnaryOp> * __thiscall
wasm::Random::FeatureOptions<wasm::UnaryOp>::add<>
          (FeatureOptions<wasm::UnaryOp> *this,FeatureSet feature,UnaryOp option)

{
  iterator __position;
  vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>> *this_00;
  key_type local_20;
  UnaryOp local_1c;
  FeatureSet feature_local;
  UnaryOp option_local;
  
  local_20.features = feature.features;
  local_1c = option;
  this_00 = (vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
            ::operator[](&this->options,&local_20);
  __position._M_current = *(UnaryOp **)(this_00 + 8);
  if (__position._M_current == *(UnaryOp **)(this_00 + 0x10)) {
    std::vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>>::
    _M_realloc_insert<wasm::UnaryOp_const&>(this_00,__position,&local_1c);
  }
  else {
    *__position._M_current = option;
    *(UnaryOp **)(this_00 + 8) = __position._M_current + 1;
  }
  return this;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }